

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O2

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::
CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
::spans(vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
       CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
       *this)

{
  undefined8 *puVar1;
  pointer pIVar2;
  undefined8 uVar3;
  size_type sVar4;
  size_type __n;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  Interval domain;
  vector<double,_std::allocator<double>_> intersection;
  VectorXd local_a0;
  VectorXd local_90;
  __shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2> local_80;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots_v;
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_> curve;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> knots_u;
  
  std::__shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,
             &(this->m_curve_geometry).
              super___shared_ptr<anurbs::NurbsCurveGeometry<2L>,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_CurveBase<3L>)._vptr_CurveBase[3])(this);
  domain.m_t0._4_4_ = extraout_XMM0_Db;
  domain.m_t0._0_4_ = extraout_XMM0_Da;
  domain.m_t1 = in_XMM1_Qa;
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>::Curve
            (&curve,(shared_ptr<anurbs::NurbsCurveGeometry<2L>_> *)&local_80,domain);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)&knots_v,
             &(this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>);
  NurbsSurfaceGeometry<3L>::knots_u
            (&knots_u,(NurbsSurfaceGeometry<3L> *)
                      knots_v.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &knots_v.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              .field_0x8);
  std::__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2> *)
             &intersection,
             &(this->m_surface_geometry).
              super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>);
  NurbsSurfaceGeometry<3L>::knots_v
            (&knots_v,(NurbsSurfaceGeometry<3L> *)
                      intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_90,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&knots_u);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_a0,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&knots_v);
  CurveSpanIntersection::compute
            (&intersection,&curve.super_CurveBase<2L>,&local_90,&local_a0,0.0001,true);
  free(local_a0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_90.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  __n = ((long)intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) - 1;
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_90);
  pIVar2 = (__return_storage_ptr__->
           super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = 0;
  if ((long)__n < 1) {
    __n = sVar4;
  }
  for (; __n * 8 != sVar4; sVar4 = sVar4 + 8) {
    uVar3 = ((undefined8 *)
            ((long)intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + sVar4))[1];
    puVar1 = (undefined8 *)((long)&pIVar2->m_t0 + sVar4 * 2);
    *puVar1 = *(undefined8 *)
               ((long)intersection.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + sVar4);
    puVar1[1] = uVar3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&intersection.super__Vector_base<double,_std::allocator<double>_>);
  Curve<2L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>_>::~Curve(&curve);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Interval> spans() const override
    {
        Curve<2, TCurveRef> curve(curve_geometry(), domain());

        const auto knots_u = surface_geometry()->knots_u();
        const auto knots_v = surface_geometry()->knots_v();

        const auto intersection =
            CurveSpanIntersection::compute(curve, knots_u, knots_v, 1e-4, true);

        const Index nb_spans = static_cast<Index>(intersection.size() - 1);

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double t0 = intersection[i];
            double t1 = intersection[i + 1];

            result[i] = Interval(t0, t1);
        }

        return result;
    }